

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

char * nh_build_plselection_prompt
                 (char *buf,int buflen,int rolenum,int racenum,int gendnum,int alignnum)

{
  boolean bVar1;
  int num_post_attribs_00;
  char *pcVar2;
  size_t sVar3;
  char local_148 [8];
  char tmpbuf [256];
  int num_post_attribs;
  char *defprompt;
  int alignnum_local;
  int gendnum_local;
  int racenum_local;
  int rolenum_local;
  int buflen_local;
  char *buf_local;
  
  if (buflen < 0x80) {
    buf_local = "Shall I pick a character for you?";
  }
  else {
    strcpy(local_148,"Shall I pick ");
    if ((racenum == -1) && (bVar1 = validrole(rolenum), bVar1 == '\0')) {
      strcat(local_148,"a ");
    }
    else {
      strcat(local_148,"your ");
    }
    pcVar2 = eos(local_148);
    sVar3 = strlen(local_148);
    nh_root_plselection_prompt(pcVar2,buflen - (int)sVar3,rolenum,racenum,gendnum,alignnum);
    pcVar2 = s_suffix(local_148);
    sprintf(buf,"%s",pcVar2);
    num_post_attribs_00 = (int)post_attribs;
    if (post_attribs != '\0') {
      if (pa[2] != '\0') {
        pcVar2 = eos(buf);
        promptsep(pcVar2,num_post_attribs_00);
        strcat(buf,"race");
      }
      if (pa[3] != '\0') {
        pcVar2 = eos(buf);
        promptsep(pcVar2,num_post_attribs_00);
        strcat(buf,"role");
      }
      if (pa[1] != '\0') {
        pcVar2 = eos(buf);
        promptsep(pcVar2,num_post_attribs_00);
        strcat(buf,"gender");
      }
      if (pa[0] != '\0') {
        pcVar2 = eos(buf);
        promptsep(pcVar2,num_post_attribs_00);
        strcat(buf,"alignment");
      }
    }
    strcat(buf," for you?");
    buf_local = buf;
  }
  return buf_local;
}

Assistant:

char *nh_build_plselection_prompt(char *buf, int buflen, int rolenum, int racenum,
			       int gendnum, int alignnum)
{
	const char *defprompt = "Shall I pick a character for you?";
	int num_post_attribs = 0;
	char tmpbuf[BUFSZ];
	
	if (buflen < QBUFSZ)
		return (char *)defprompt;

	strcpy(tmpbuf, "Shall I pick ");
	if (racenum != ROLE_NONE || validrole(rolenum))
		strcat(tmpbuf, "your ");
	else {
		strcat(tmpbuf, "a ");
	}
	/* <your> */

	nh_root_plselection_prompt(eos(tmpbuf), buflen - strlen(tmpbuf),
					rolenum, racenum, gendnum, alignnum);
	sprintf(buf, "%s", s_suffix(tmpbuf));

	/* buf should now be:
	 * < your lawful female gnomish cavewoman's> || <your lawful female gnome's>
	 *    || <your lawful female character's>
	 *
         * Now append the post attributes to it
	 */

	num_post_attribs = post_attribs;
	if (post_attribs) {
		if (pa[BP_RACE]) {
			promptsep(eos(buf), num_post_attribs);
			strcat(buf, "race");
		}
		if (pa[BP_ROLE]) {
			promptsep(eos(buf), num_post_attribs);
			strcat(buf, "role");
		}
		if (pa[BP_GEND]) {
			promptsep(eos(buf), num_post_attribs);
			strcat(buf, "gender");
		}
		if (pa[BP_ALIGN]) {
			promptsep(eos(buf), num_post_attribs);
			strcat(buf, "alignment");
		}
	}
	strcat(buf, " for you?");
	return buf;
}